

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureMipmapTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles3::Functional::Texture3DLodControlCase::iterate(Texture3DLodControlCase *this)

{
  TextureFormat TVar1;
  uint uVar2;
  Texture3D *pTVar3;
  RenderContext *context;
  TestLog *pTVar4;
  int width;
  int height;
  int i;
  int iVar5;
  int iVar6;
  deUint32 dVar7;
  int iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  RenderTarget *pRVar9;
  long lVar10;
  int iVar11;
  Surface *pSVar12;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  char *description;
  int iVar13;
  void *pvVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  RandomViewport viewport;
  int local_490;
  Vector<int,_4> res;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_478 [2];
  undefined1 local_458 [40];
  undefined1 local_430 [40];
  TextureRenderer *local_408;
  Surface renderedFrame;
  vector<float,_std::allocator<float>_> texCoord;
  Surface referenceFrame;
  undefined1 local_3b8 [40];
  Surface errorMask;
  LodPrecision lodPrec;
  Texture3DView local_368;
  PixelFormat *local_358;
  Texture3D *local_350;
  Vector<int,_4> res_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_338;
  _Alloc_hider local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318 [6];
  undefined1 local_2b0 [24];
  undefined8 local_298;
  _func_int **pp_Stack_290;
  BVec4 local_288;
  ReferenceParams sampleParams;
  undefined1 local_1f0 [8];
  _func_int **pp_Stack_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  _Alloc_hider local_1d0;
  undefined4 local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_1c0 [4];
  ios_base local_178 [264];
  TextureFormatInfo fmtInfo;
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar10 = CONCAT44(extraout_var,iVar5);
  pTVar3 = this->m_texture;
  tcu::getTextureFormatInfo(&fmtInfo,(TextureFormat *)&pTVar3->m_refTexture);
  iVar5 = (pTVar3->m_refTexture).m_width;
  iVar8 = (pTVar3->m_refTexture).m_height;
  local_350 = pTVar3;
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  dVar7 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&viewport,(RenderTarget *)CONCAT44(extraout_var_00,iVar6),iVar5 << 2,iVar8 << 2,dVar7);
  iVar5 = viewport.width + 3;
  if (-1 < viewport.width) {
    iVar5 = viewport.width;
  }
  iVar8 = viewport.height + 3;
  if (-1 < viewport.height) {
    iVar8 = viewport.height;
  }
  tcu::Surface::Surface(&renderedFrame,viewport.width,viewport.height);
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  glu::TextureTestUtil::ReferenceParams::ReferenceParams(&sampleParams,TEXTURETYPE_3D);
  glu::mapGLSampler((Sampler *)local_1f0,0x812f,0x812f,0x812f,this->m_minFilter,0x2600);
  sampleParams.sampler.magFilter = local_1e0._M_allocated_capacity._0_4_;
  sampleParams.sampler.lodThreshold = (float)local_1e0._M_allocated_capacity._4_4_;
  sampleParams.sampler.normalizedCoords = (bool)local_1e0._M_local_buf[8];
  sampleParams.sampler._25_3_ = local_1e0._9_3_;
  sampleParams.sampler.compare = local_1e0._12_4_;
  sampleParams.sampler.wrapS = local_1f0._0_4_;
  sampleParams.sampler.wrapT = local_1f0._4_4_;
  sampleParams.sampler._8_8_ = pp_Stack_1e8;
  sampleParams.sampler._32_8_ = local_1d0._M_p;
  sampleParams.sampler.borderColor.v.uData[1] = local_1c8;
  sampleParams.super_RenderParams.samplerType =
       glu::TextureTestUtil::getSamplerType
                 ((pTVar3->m_refTexture).super_TextureLevelPyramid.m_format);
  sampleParams.super_RenderParams.colorBias.m_data[0] = fmtInfo.lookupBias.m_data[0];
  sampleParams.super_RenderParams.colorBias.m_data[1] = fmtInfo.lookupBias.m_data[1];
  sampleParams.super_RenderParams.colorBias.m_data[2] = fmtInfo.lookupBias.m_data[2];
  sampleParams.super_RenderParams.colorBias.m_data[3] = fmtInfo.lookupBias.m_data[3];
  sampleParams.super_RenderParams.colorScale.m_data[0] = fmtInfo.lookupScale.m_data[0];
  sampleParams.super_RenderParams.colorScale.m_data[1] = fmtInfo.lookupScale.m_data[1];
  sampleParams.super_RenderParams.colorScale.m_data[2] = fmtInfo.lookupScale.m_data[2];
  sampleParams.super_RenderParams.colorScale.m_data[3] = fmtInfo.lookupScale.m_data[3];
  (**(code **)(lVar10 + 0xb8))(0x806f,this->m_texture->m_glTexture);
  (**(code **)(lVar10 + 0x1360))(0x806f,0x2802,0x812f);
  (**(code **)(lVar10 + 0x1360))(0x806f,0x2803,0x812f);
  (**(code **)(lVar10 + 0x1360))(0x806f,0x8072,0x812f);
  (**(code **)(lVar10 + 0x1360))(0x806f,0x2801,this->m_minFilter);
  (**(code **)(lVar10 + 0x1360))(0x806f,0x2800,0x2600);
  dVar7 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar7,"After texture setup",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureMipmapTests.cpp"
                  ,0x86c);
  iVar5 = iVar5 >> 2;
  iVar8 = iVar8 >> 2;
  local_408 = &this->m_renderer;
  local_490 = 0;
  iVar6 = 0;
  do {
    iVar18 = 0;
    iVar13 = 0;
    for (iVar15 = 0; iVar15 != 4; iVar15 = iVar15 + 1) {
      iVar11 = viewport.width + iVar13;
      if (iVar15 != 3) {
        iVar11 = iVar5;
      }
      iVar16 = viewport.height - iVar6 * iVar8;
      if (iVar6 != 3) {
        iVar16 = iVar8;
      }
      getBasicTexCoord3D(&texCoord,local_490 + iVar15);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
                (this,(ulong)(uint)(local_490 + iVar15));
      (**(code **)(lVar10 + 0x1a00))(viewport.x + iVar18,viewport.y + iVar6 * iVar8,iVar11,iVar16);
      iVar13 = iVar13 - iVar5;
      iVar18 = iVar18 + iVar5;
      deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
                (local_408,0,
                 texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,&sampleParams.super_RenderParams);
    }
    iVar6 = iVar6 + 1;
    local_490 = local_490 + 4;
  } while (iVar6 != 4);
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  res_1.m_data[0] = 8;
  res_1.m_data[1] = 3;
  pvVar14 = (void *)renderedFrame.m_pixels.m_cap;
  if (renderedFrame.m_pixels.m_cap != 0) {
    pvVar14 = renderedFrame.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1f0,(TextureFormat *)&res_1,renderedFrame.m_width,
             renderedFrame.m_height,1,pvVar14);
  glu::readPixels(context,viewport.x,viewport.y,(PixelBufferAccess *)local_1f0);
  pRVar9 = Context::getRenderTarget((this->super_TestCase).m_context);
  uVar2 = this->m_minFilter;
  tcu::Surface::Surface(&referenceFrame,viewport.width,viewport.height);
  tcu::Surface::Surface(&errorMask,viewport.width,viewport.height);
  local_358 = &pRVar9->m_pixelFormat;
  lVar10 = 0;
  do {
    *(undefined4 *)(local_2b0 + lVar10 * 4) = 0x16;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  lVar10 = 3;
  do {
    *(undefined4 *)(local_2b0 + lVar10 * 4) = 0x10;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 6);
  local_298._0_4_ = 0.0;
  local_298._4_4_ = 0.0;
  pp_Stack_290 = (_func_int **)0x0;
  local_288.m_data[0] = true;
  local_288.m_data[1] = true;
  local_288.m_data[2] = true;
  local_288.m_data[3] = true;
  lodPrec.rule = RULE_OPENGL;
  lodPrec.derivateBits = 0x16;
  lodPrec.lodBits = 0x10;
  local_2b0._0_4_ = 0x14;
  local_2b0._4_4_ = 0x14;
  local_2b0._8_4_ = 0x14;
  local_2b0._12_4_ = 0x10;
  local_2b0._16_4_ = 0x10;
  local_2b0._20_4_ = 0x10;
  local_430._0_4_ = (pRVar9->m_pixelFormat).redBits;
  local_430._4_4_ = (pRVar9->m_pixelFormat).greenBits;
  local_430._8_4_ = (pRVar9->m_pixelFormat).blueBits;
  local_430._12_4_ = (pRVar9->m_pixelFormat).alphaBits;
  res.m_data[0] = 0;
  res.m_data[1] = 0;
  res.m_data[2] = 0;
  res.m_data[3] = 0;
  lVar10 = 0;
  do {
    res.m_data[lVar10] = *(int *)(local_430 + lVar10 * 4) + ~(uint)((uVar2 & 0xfffffffe) == 0x2702);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 4);
  local_458._0_4_ = R;
  local_458._4_4_ = SNORM_INT8;
  local_458._8_8_ = 0;
  res_1.m_data[0] = 0;
  res_1.m_data[1] = 0;
  res_1.m_data[2] = 0;
  res_1.m_data[3] = 0;
  lVar10 = 0;
  do {
    iVar6 = *(int *)(local_458 + lVar10 * 4);
    if (*(int *)(local_458 + lVar10 * 4) < res.m_data[lVar10]) {
      iVar6 = res.m_data[lVar10];
    }
    res_1.m_data[lVar10] = iVar6;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 4);
  tcu::computeFixedPointThreshold((tcu *)local_1f0,&res_1);
  local_298._0_4_ = (float)local_1f0._0_4_;
  local_298._4_4_ = (float)local_1f0._4_4_;
  pp_Stack_290 = pp_Stack_1e8;
  local_288.m_data[1] = 0 < (pRVar9->m_pixelFormat).greenBits;
  local_288.m_data[0] = 0 < (pRVar9->m_pixelFormat).redBits;
  local_288.m_data[2] = 0 < (pRVar9->m_pixelFormat).blueBits;
  local_288.m_data[3] = 0 < (pRVar9->m_pixelFormat).alphaBits;
  lodPrec.derivateBits = 10;
  lodPrec.lodBits = 8;
  iVar6 = 0;
  iVar13 = 0;
  iVar15 = 0;
  do {
    iVar18 = iVar13 * iVar8;
    iVar16 = 0;
    iVar11 = 0;
    iVar17 = 0;
    local_408 = (TextureRenderer *)CONCAT44(local_408._4_4_,iVar13);
    do {
      width = viewport.width + iVar11;
      if (iVar17 != 3) {
        width = iVar5;
      }
      height = viewport.height - iVar18;
      if (iVar13 != 3) {
        height = iVar8;
      }
      getBasicTexCoord3D(&texCoord,iVar6 + iVar17);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])
                (this,&sampleParams,(ulong)(uint)(iVar6 + iVar17));
      tcu::SurfaceAccess::SurfaceAccess
                ((SurfaceAccess *)local_1f0,&referenceFrame,local_358,iVar16,iVar18,width,height);
      res_1.m_data._8_8_ = (local_350->m_refTexture).m_view.m_levels;
      res_1.m_data[0] = (local_350->m_refTexture).m_view.m_numLevels;
      glu::TextureTestUtil::sampleTexture
                ((SurfaceAccess *)local_1f0,(Texture3DView *)&res_1,
                 texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,&sampleParams);
      res.m_data[0] = 8;
      res.m_data[1] = 3;
      pvVar14 = (void *)renderedFrame.m_pixels.m_cap;
      if (renderedFrame.m_pixels.m_cap != 0) {
        pvVar14 = renderedFrame.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)&res_1,(TextureFormat *)&res,renderedFrame.m_width,
                 renderedFrame.m_height,1,pvVar14);
      tcu::getSubregion((PixelBufferAccess *)local_1f0,(PixelBufferAccess *)&res_1,iVar16,iVar18,
                        width,height);
      local_458._0_4_ = RGBA;
      local_458._4_4_ = UNORM_INT8;
      pvVar14 = (void *)referenceFrame.m_pixels.m_cap;
      if (referenceFrame.m_pixels.m_cap != 0) {
        pvVar14 = referenceFrame.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_430,(TextureFormat *)local_458,referenceFrame.m_width,
                 referenceFrame.m_height,1,pvVar14);
      tcu::getSubregion((PixelBufferAccess *)&res,(PixelBufferAccess *)local_430,iVar16,iVar18,width
                        ,height);
      local_368.m_numLevels = 8;
      local_368._4_4_ = 3;
      pvVar14 = (void *)errorMask.m_pixels.m_cap;
      if (errorMask.m_pixels.m_cap != 0) {
        pvVar14 = errorMask.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_3b8,(TextureFormat *)&local_368,errorMask.m_width,
                 errorMask.m_height,1,pvVar14);
      tcu::getSubregion((PixelBufferAccess *)local_458,(PixelBufferAccess *)local_3b8,iVar16,iVar18,
                        width,height);
      local_368.m_levels = (this->m_texture->m_refTexture).m_view.m_levels;
      local_368.m_numLevels = (this->m_texture->m_refTexture).m_view.m_numLevels;
      iVar13 = glu::TextureTestUtil::computeTextureLookupDiff
                         ((ConstPixelBufferAccess *)local_1f0,(ConstPixelBufferAccess *)&res,
                          (PixelBufferAccess *)local_458,&local_368,
                          texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,&sampleParams,
                          (LookupPrecision *)local_2b0,&lodPrec,
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->
                          m_watchDog);
      iVar17 = iVar17 + 1;
      iVar15 = iVar15 + iVar13;
      iVar11 = iVar11 - iVar5;
      iVar16 = iVar16 + iVar5;
      iVar13 = (int)local_408;
    } while (iVar17 != 4);
    iVar13 = (int)local_408 + 1;
    iVar6 = iVar6 + 4;
  } while (iVar13 != 4);
  if (0 < iVar15) {
    local_1f0 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1e8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pp_Stack_1e8,"ERROR: Image verification failed, found ",0x28);
    std::ostream::operator<<((ostringstream *)&pp_Stack_1e8,iVar15);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pp_Stack_1e8," invalid pixels!",0x10);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1f0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1e8);
    std::ios_base::~ios_base(local_178);
  }
  pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  res.m_data._0_8_ = local_478;
  std::__cxx11::string::_M_construct<char_const*>((string *)&res,"Result","");
  local_430._0_8_ = (long)local_430 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_430,"Verification result","");
  tcu::LogImageSet::LogImageSet((LogImageSet *)&res_1,(string *)&res,(string *)local_430);
  tcu::TestLog::startImageSet(pTVar4,(char *)res_1.m_data._0_8_,local_328._M_p);
  local_458._0_8_ = (long)local_458 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"Rendered","");
  TVar1 = (TextureFormat)((long)local_3b8 + 0x10);
  local_3b8._0_8_ = TVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"Rendered image","");
  pSVar12 = &renderedFrame;
  tcu::LogImage::LogImage
            ((LogImage *)local_1f0,(string *)local_458,(string *)local_3b8,pSVar12,
             QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write((LogImage *)local_1f0,(int)pTVar4,__buf,(size_t)pSVar12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_p != aaStack_1c0) {
    operator_delete(local_1d0._M_p,
                    CONCAT44(aaStack_1c0[0]._M_allocated_capacity._4_4_,
                             (undefined4)aaStack_1c0[0]._M_allocated_capacity) + 1);
  }
  if (local_1f0 != (undefined1  [8])&local_1e0) {
    operator_delete((void *)local_1f0,local_1e0._M_allocated_capacity + 1);
  }
  if ((TextureFormat)local_3b8._0_8_ != TVar1) {
    operator_delete((void *)local_3b8._0_8_,local_3b8._16_8_ + 1);
  }
  if (local_458._0_8_ != (long)local_458 + 0x10) {
    operator_delete((void *)local_458._0_8_,local_458._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_p != local_318) {
    operator_delete(local_328._M_p,local_318[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)res_1.m_data._0_8_ != &local_338) {
    operator_delete((void *)res_1.m_data._0_8_,local_338._M_allocated_capacity + 1);
  }
  if (local_430._0_8_ != (long)local_430 + 0x10) {
    operator_delete((void *)local_430._0_8_,local_430._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)res.m_data._0_8_ != local_478) {
    operator_delete((void *)res.m_data._0_8_,local_478[0]._M_allocated_capacity + 1);
  }
  if (0 < iVar15) {
    pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    res.m_data._0_8_ = local_478;
    std::__cxx11::string::_M_construct<char_const*>((string *)&res,"Reference","");
    local_430._0_8_ = (long)local_430 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_430,"Ideal reference","");
    pSVar12 = &referenceFrame;
    tcu::LogImage::LogImage
              ((LogImage *)local_1f0,(string *)&res,(string *)local_430,pSVar12,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    iVar5 = (int)pTVar4;
    tcu::LogImage::write((LogImage *)local_1f0,iVar5,__buf_00,(size_t)pSVar12);
    local_458._0_8_ = (long)local_458 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"ErrorMask","");
    local_3b8._0_8_ = TVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"Error mask","");
    pSVar12 = &errorMask;
    tcu::LogImage::LogImage
              ((LogImage *)&res_1,(string *)local_458,(string *)local_3b8,pSVar12,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&res_1,iVar5,__buf_01,(size_t)pSVar12);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_p != local_318) {
      operator_delete(local_328._M_p,local_318[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)res_1.m_data._0_8_ != &local_338) {
      operator_delete((void *)res_1.m_data._0_8_,local_338._M_allocated_capacity + 1);
    }
    if ((TextureFormat)local_3b8._0_8_ != TVar1) {
      operator_delete((void *)local_3b8._0_8_,local_3b8._16_8_ + 1);
    }
    if (local_458._0_8_ != (long)local_458 + 0x10) {
      operator_delete((void *)local_458._0_8_,local_458._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_p != aaStack_1c0) {
      operator_delete(local_1d0._M_p,
                      CONCAT44(aaStack_1c0[0]._M_allocated_capacity._4_4_,
                               (undefined4)aaStack_1c0[0]._M_allocated_capacity) + 1);
    }
    if (local_1f0 != (undefined1  [8])&local_1e0) {
      operator_delete((void *)local_1f0,local_1e0._M_allocated_capacity + 1);
    }
    if (local_430._0_8_ != (long)local_430 + 0x10) {
      operator_delete((void *)local_430._0_8_,local_430._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)res.m_data._0_8_ != local_478) {
      operator_delete((void *)res.m_data._0_8_,local_478[0]._M_allocated_capacity + 1);
    }
  }
  tcu::TestLog::endImageSet(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log)
  ;
  description = "Pass";
  if (iVar15 != 0) {
    description = "Image verification failed";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(iVar15 != 0),
             description);
  tcu::Surface::~Surface(&errorMask);
  tcu::Surface::~Surface(&referenceFrame);
  if (texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  tcu::Surface::~Surface(&renderedFrame);
  return STOP;
}

Assistant:

Texture3DLodControlCase::IterateResult Texture3DLodControlCase::iterate (void)
{
	const glw::Functions&			gl					= m_context.getRenderContext().getFunctions();

	const deUint32					wrapS				= GL_CLAMP_TO_EDGE;
	const deUint32					wrapT				= GL_CLAMP_TO_EDGE;
	const deUint32					wrapR				= GL_CLAMP_TO_EDGE;
	const deUint32					magFilter			= GL_NEAREST;
	const tcu::Texture3D&			refTexture			= m_texture->getRefTexture();
	const tcu::TextureFormat&		texFmt				= refTexture.getFormat();
	const tcu::TextureFormatInfo	fmtInfo				= tcu::getTextureFormatInfo(texFmt);
	const int						texWidth			= refTexture.getWidth();
	const int						texHeight			= refTexture.getHeight();

	const tcu::RenderTarget&		renderTarget		= m_context.getRenderContext().getRenderTarget();
	const RandomViewport			viewport			(renderTarget, texWidth*4, texHeight*4, deStringHash(getName()));

	// Viewport is divided into 4x4 grid.
	const int						gridWidth			= 4;
	const int						gridHeight			= 4;
	const int						cellWidth			= viewport.width / gridWidth;
	const int						cellHeight			= viewport.height / gridHeight;

	tcu::Surface					renderedFrame		(viewport.width, viewport.height);
	vector<float>					texCoord;
	ReferenceParams					sampleParams		(TEXTURETYPE_3D);

	// Sampling parameters.
	sampleParams.sampler		= glu::mapGLSampler(wrapS, wrapT, wrapR, m_minFilter, magFilter);
	sampleParams.samplerType	= getSamplerType(texFmt);
	sampleParams.colorBias		= fmtInfo.lookupBias;
	sampleParams.colorScale		= fmtInfo.lookupScale;

	// Bind texture and setup sampler parameters.
	gl.bindTexture	(GL_TEXTURE_3D, m_texture->getGLTexture());
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_WRAP_S,		wrapS);
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_WRAP_T,		wrapT);
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_WRAP_R,		wrapR);
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_MIN_FILTER,	m_minFilter);
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_MAG_FILTER,	magFilter);

	GLU_EXPECT_NO_ERROR(gl.getError(), "After texture setup");

	// Render cells.
	for (int gridY = 0; gridY < gridHeight; gridY++)
	{
		for (int gridX = 0; gridX < gridWidth; gridX++)
		{
			int		curX		= cellWidth*gridX;
			int		curY		= cellHeight*gridY;
			int		curW		= gridX+1 == gridWidth ? (viewport.width-curX) : cellWidth;
			int		curH		= gridY+1 == gridHeight ? (viewport.height-curY) : cellHeight;
			int		cellNdx		= gridY*gridWidth + gridX;

			// Compute texcoord.
			getBasicTexCoord3D(texCoord, cellNdx);

			setTextureParams(cellNdx);

			// Render with GL.
			gl.viewport(viewport.x+curX, viewport.y+curY, curW, curH);
			m_renderer.renderQuad(0, &texCoord[0], sampleParams);
		}
	}

	// Read result.
	glu::readPixels(m_context.getRenderContext(), viewport.x, viewport.y, renderedFrame.getAccess());

	// Compare and log
	{
		const tcu::PixelFormat&	pixelFormat		= m_context.getRenderTarget().getPixelFormat();
		const bool				isTrilinear		= m_minFilter == GL_NEAREST_MIPMAP_LINEAR || m_minFilter == GL_LINEAR_MIPMAP_LINEAR;
		tcu::Surface			referenceFrame	(viewport.width, viewport.height);
		tcu::Surface			errorMask		(viewport.width, viewport.height);
		tcu::LookupPrecision	lookupPrec;
		tcu::LodPrecision		lodPrec			(tcu::LodPrecision::RULE_OPENGL);
		int						numFailedPixels	= 0;

		lookupPrec.coordBits		= tcu::IVec3(20, 20, 20);
		lookupPrec.uvwBits			= tcu::IVec3(16, 16, 16); // Doesn't really matter since pixels are unicolored.
		lookupPrec.colorThreshold	= tcu::computeFixedPointThreshold(max(getBitsVec(pixelFormat) - (isTrilinear ? 2 : 1), tcu::IVec4(0)));
		lookupPrec.colorMask		= getCompareMask(pixelFormat);
		lodPrec.derivateBits		= 10;
		lodPrec.lodBits				= 8;

		for (int gridY = 0; gridY < gridHeight; gridY++)
		{
			for (int gridX = 0; gridX < gridWidth; gridX++)
			{
				const int		curX		= cellWidth*gridX;
				const int		curY		= cellHeight*gridY;
				const int		curW		= gridX+1 == gridWidth ? (viewport.width-curX) : cellWidth;
				const int		curH		= gridY+1 == gridHeight ? (viewport.height-curY) : cellHeight;
				const int		cellNdx		= gridY*gridWidth + gridX;

				getBasicTexCoord3D(texCoord, cellNdx);
				getReferenceParams(sampleParams, cellNdx);

				// Render ideal result
				sampleTexture(tcu::SurfaceAccess(referenceFrame, pixelFormat, curX, curY, curW, curH),
							  refTexture, &texCoord[0], sampleParams);

				// Compare this cell
				numFailedPixels += computeTextureLookupDiff(tcu::getSubregion(renderedFrame.getAccess(), curX, curY, curW, curH),
															tcu::getSubregion(referenceFrame.getAccess(), curX, curY, curW, curH),
															tcu::getSubregion(errorMask.getAccess(), curX, curY, curW, curH),
															m_texture->getRefTexture(), &texCoord[0], sampleParams,
															lookupPrec, lodPrec, m_testCtx.getWatchDog());
			}
		}

		if (numFailedPixels > 0)
			m_testCtx.getLog() << TestLog::Message << "ERROR: Image verification failed, found " << numFailedPixels << " invalid pixels!" << TestLog::EndMessage;

		m_testCtx.getLog() << TestLog::ImageSet("Result", "Verification result")
							<< TestLog::Image("Rendered", "Rendered image", renderedFrame);

		if (numFailedPixels > 0)
		{
			m_testCtx.getLog() << TestLog::Image("Reference", "Ideal reference", referenceFrame)
								<< TestLog::Image("ErrorMask", "Error mask", errorMask);
		}

		m_testCtx.getLog() << TestLog::EndImageSet;

		{
			const bool isOk = numFailedPixels == 0;
			m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									isOk ? "Pass"				: "Image verification failed");
		}
	}

	return STOP;
}